

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O2

char * cmsysEncoding_DupToNarrow(wchar_t *str)

{
  size_t sVar1;
  char *dest;
  size_t __size;
  
  dest = (char *)0x0;
  sVar1 = cmsysEncoding_wcstombs((char *)0x0,str,0);
  __size = sVar1 + 1;
  if (__size != 0) {
    dest = (char *)malloc(__size);
    if (dest == (char *)0x0) {
      dest = (char *)0x0;
    }
    else {
      *dest = '\0';
      cmsysEncoding_wcstombs(dest,str,__size);
    }
  }
  return dest;
}

Assistant:

char* kwsysEncoding_DupToNarrow(const wchar_t* str)
{
  char* ret = NULL;
  size_t length = kwsysEncoding_wcstombs(0, str, 0) + 1;
  if(length > 0)
    {
    ret = (char*)malloc(length);
    if(ret)
      {
      ret[0] = 0;
      kwsysEncoding_wcstombs(ret, str, length);
      }
    }
  return ret;
}